

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

char * Wlc_PrsReadName(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins)

{
  char *pcVar1;
  byte bVar2;
  Wlc_Ntk_t *p_00;
  Wlc_Obj_t *pWVar3;
  uint uVar4;
  uint Entry;
  Vec_Int_t *vFanins_00;
  char *pcVar5;
  int iVar6;
  char *pcVar7;
  bool bVar8;
  int XValue;
  int Signed;
  int Range;
  int fFound;
  char Buffer [100];
  uint local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  char local_98 [104];
  
  pcVar5 = pStr + -1;
  do {
    pcVar7 = pcVar5;
    pcVar5 = pcVar7 + 1;
  } while (pcVar7[1] == ' ');
  if (0xf5 < (byte)(pcVar7[1] - 0x3aU)) {
    local_a8 = 0;
    vFanins_00 = (Vec_Int_t *)calloc(1,0x10);
    pcVar7 = Wlc_PrsReadConstant(p,pcVar7 + 1,vFanins_00,&local_a0,&local_a4,(int *)&local_a8);
    if (pcVar7 == (char *)0x0) {
      if (vFanins_00->pArray != (int *)0x0) {
        free(vFanins_00->pArray);
      }
      free(vFanins_00);
      return (char *)0x0;
    }
    Entry = Wlc_ObjAlloc(p->pNtk,6,local_a4,local_a0 + -1,0);
    if (((int)Entry < 1) || (p_00 = p->pNtk, p_00->nObjsAlloc <= (int)Entry)) {
LAB_003798ad:
      __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                    ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
    }
    Wlc_ObjAddFanins(p_00,p_00->pObjs + Entry,vFanins_00);
    if (p->pNtk->nObjsAlloc <= (int)Entry) goto LAB_003798ad;
    pWVar3 = p->pNtk->pObjs;
    *(ushort *)(pWVar3 + Entry) =
         (ushort)*(undefined4 *)(pWVar3 + Entry) & 0xf7ff | (ushort)((local_a8 & 1) << 0xb);
    if (vFanins_00->pArray != (int *)0x0) {
      free(vFanins_00->pArray);
    }
    free(vFanins_00);
    p->nConsts = p->nConsts + 1;
    sprintf(local_98,"_c%d_");
    uVar4 = Abc_NamStrFindOrAdd(p->pNtk->pManName,local_98,&local_9c);
    if (local_9c != 0) {
      Wlc_PrsWriteErrorMessage(p,pcVar7,"Name %s is already used.",local_98);
      return (char *)0x0;
    }
    if (Entry != uVar4) {
      __assert_fail("iObj == NameId",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcReadVer.c"
                    ,0x291,"char *Wlc_PrsReadName(Wlc_Prs_t *, char *, Vec_Int_t *)");
    }
    goto LAB_00379861;
  }
  do {
    bVar2 = pcVar7[1];
    pcVar7 = pcVar7 + 1;
  } while (bVar2 == 0x20);
  if (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
    if (bVar2 != 0) goto LAB_0037976f;
    pcVar5 = Wlc_PrsFindName::Buffer;
  }
  else {
    if ((0x3b < bVar2 - 0x24) || ((0x900000000000001U >> ((ulong)(bVar2 - 0x24) & 0x3f) & 1) == 0))
    {
      Wlc_PrsWriteErrorMessage(p,(char *)0x0,"Cannot read name in assign-statement.");
      return (char *)0x0;
    }
LAB_0037976f:
    pcVar5 = Wlc_PrsFindName::Buffer;
    bVar8 = true;
    iVar6 = 0;
    do {
      if (bVar8) {
        if (((byte)(bVar2 - 0x30) < 10) || ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a)) {
          bVar8 = true;
          goto joined_r0x003797c1;
        }
        bVar8 = true;
        if (bVar2 != 0x24) {
          if (bVar2 == 0x5c) goto LAB_003797ce;
          if (bVar2 == 0x5f) goto LAB_003797dc;
          break;
        }
      }
      else {
        if (bVar2 == 0x20) {
          iVar6 = iVar6 + -1;
          bVar8 = iVar6 == 0;
          goto LAB_003797dc;
        }
        bVar8 = false;
joined_r0x003797c1:
        if (bVar2 == 0x5c) {
LAB_003797ce:
          iVar6 = iVar6 + 1;
          bVar8 = false;
        }
      }
LAB_003797dc:
      *pcVar5 = bVar2;
      pcVar5 = (char *)((byte *)pcVar5 + 1);
      bVar2 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    } while (bVar2 != 0);
  }
  *pcVar5 = 0;
  Entry = Abc_NamStrFindOrAdd(p->pNtk->pManName,Wlc_PrsFindName::Buffer,&local_9c);
  if (local_9c == 0) {
    Wlc_PrsWriteErrorMessage(p,pcVar7,"Name %s is used but not declared.",Wlc_PrsFindName::Buffer);
    return (char *)0x0;
  }
LAB_00379861:
  Vec_IntPush(vFanins,Entry);
  pcVar5 = pcVar7 + -1;
  do {
    pcVar7 = pcVar5 + 1;
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar7;
  } while (*pcVar1 == ' ');
  return pcVar7;
}

Assistant:

static inline char * Wlc_PrsReadName( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins )
{
    int NameId, fFound, iObj;
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( Wlc_PrsIsDigit(pStr) )
    {
        char Buffer[100];
        int Range, Signed, XValue = 0;
        Vec_Int_t * vFanins = Vec_IntAlloc(0);
        pStr = Wlc_PrsReadConstant( p, pStr, vFanins, &Range, &Signed, &XValue );
        if ( pStr == NULL )
        {
            Vec_IntFree( vFanins );
            return 0;
        }
        // create new node
        iObj = Wlc_ObjAlloc( p->pNtk, WLC_OBJ_CONST, Signed, Range-1, 0 );
        Wlc_ObjAddFanins( p->pNtk, Wlc_NtkObj(p->pNtk, iObj), vFanins );
        Wlc_NtkObj(p->pNtk, iObj)->fXConst = XValue;
        Vec_IntFree( vFanins );
        // add node's name
        sprintf( Buffer, "_c%d_", p->nConsts++ );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, Buffer, &fFound );
        if ( fFound )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is already used.", Buffer );
        assert( iObj == NameId );
    }
    else
    {
        char * pName;
        pStr = Wlc_PrsFindName( pStr, &pName );
        if ( pStr == NULL )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in assign-statement." );
        NameId = Abc_NamStrFindOrAdd( p->pNtk->pManName, pName, &fFound );
        if ( !fFound )
            return (char *)(ABC_PTRINT_T)Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is used but not declared.", pName );
    }
    Vec_IntPush( vFanins, NameId );
    return Wlc_PrsSkipSpaces( pStr );
}